

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O2

void juzzlin::StreamTest::testTrace_higherLoggingLevel_shouldNotPrintMessage
               (string *message,string *timestampSeparator)

{
  ostream *poVar1;
  SimpleLogger local_1a0 [8];
  stringstream ss;
  ostream local_188 [376];
  
  juzzlin::SimpleLogger::setLoggingLevel(Debug);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  juzzlin::SimpleLogger::setStream(Trace,local_188);
  juzzlin::SimpleLogger::SimpleLogger(local_1a0);
  poVar1 = (ostream *)juzzlin::SimpleLogger::trace_abi_cxx11_();
  std::operator<<(poVar1,(string *)message);
  juzzlin::SimpleLogger::~SimpleLogger(local_1a0);
  assertNotMessage(&ss,message,timestampSeparator);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void testTrace_higherLoggingLevel_shouldNotPrintMessage(const std::string & message, const std::string & timestampSeparator)
{
    L::setLoggingLevel(L::Level::Debug);
    std::stringstream ss;
    L::setStream(L::Level::Trace, ss);
    L().trace() << message;
    assertNotMessage(ss, message, timestampSeparator);
}